

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool ProvideOption(Option *Handler,StringRef ArgName,StringRef Value,int argc,char **argv,int *i)

{
  int iVar1;
  StringRef Value_00;
  StringRef ArgName_00;
  StringRef ArgName_01;
  StringRef ArgName_02;
  Child CVar2;
  Child CVar3;
  bool bVar4;
  uint uVar5;
  raw_ostream *Errs;
  int iVar6;
  NodeKind LHSKind;
  uint uVar7;
  char *pcVar8;
  Child CVar9;
  Child CVar10;
  bool MultiArg;
  StringRef Value_01;
  StringRef Value_02;
  StringRef local_e0;
  int local_cc;
  char *local_c8;
  size_t local_c0;
  Child local_b8 [2];
  undefined2 local_a8;
  undefined6 uStack_a6;
  Twine local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  NodeKind local_68;
  char cStack_67;
  undefined6 uStack_66;
  uint local_60;
  undefined4 uStack_5c;
  NodeKind local_50;
  char cStack_4f;
  undefined6 uStack_4e;
  uint local_48;
  undefined4 uStack_44;
  NodeKind local_38;
  char cStack_37;
  undefined6 uStack_36;
  
  local_e0.Length = Value.Length;
  local_e0.Data = Value.Data;
  local_c0 = ArgName.Length;
  local_c8 = ArgName.Data;
  uVar7 = Handler->AdditionalVals;
  uVar5 = *(uint *)&Handler->field_0xc >> 3 & 3;
  local_cc = argc;
  if (uVar5 == 0) {
    uVar5 = (*Handler->_vptr_Option[1])();
  }
  if (uVar5 == 3) {
    if (uVar7 == 0) {
      if (local_e0.Data == (char *)0x0) goto LAB_00117da5;
      llvm::Twine::Twine((Twine *)&local_48,"does not allow a value! \'");
      llvm::Twine::Twine((Twine *)&local_60,&local_e0);
      if ((local_38 == NullKind) || (local_50 == NullKind)) {
        local_a8 = 0x100;
      }
      else if (local_38 == EmptyKind) {
        local_a8._1_1_ = cStack_4f;
        local_a8._0_1_ = local_50;
        uStack_a6 = uStack_4e;
        local_b8[0]._0_4_ = local_60;
        local_b8[0]._4_4_ = uStack_5c;
      }
      else if (local_50 == EmptyKind) {
        local_a8._1_1_ = cStack_37;
        local_a8._0_1_ = local_38;
        uStack_a6 = uStack_36;
        local_b8[0]._0_4_ = local_48;
        local_b8[0]._4_4_ = uStack_44;
      }
      else {
        CVar9._4_4_ = uStack_44;
        CVar9.decUI = local_48;
        if (cStack_37 != '\x01') {
          local_38 = TwineKind;
          CVar9.twine = (Twine *)&local_48;
        }
        if (cStack_4f != '\x01') {
          local_50 = TwineKind;
        }
        CVar3._4_4_ = uStack_5c;
        CVar3.decUI = local_60;
        CVar10.twine = (Twine *)&local_60;
        if (cStack_4f == '\x01') {
          CVar10 = CVar3;
        }
        llvm::Twine::Twine((Twine *)local_b8,CVar9,local_38,CVar10,local_50);
      }
      llvm::Twine::Twine((Twine *)&local_78,"\' specified.");
      if (((NodeKind)local_a8 == NullKind) || (local_68 == NullKind)) {
        local_98._16_2_ = 0x100;
      }
      else if ((NodeKind)local_a8 == EmptyKind) {
        local_98.RHSKind = cStack_67;
        local_98.LHSKind = local_68;
        local_98._18_6_ = uStack_66;
      }
      else if (local_68 == EmptyKind) {
        local_98.LHSKind = (NodeKind)local_a8;
        local_98.RHSKind = local_a8._1_1_;
        local_98._18_6_ = uStack_a6;
      }
      else {
        CVar10._4_4_ = local_b8[0]._4_4_;
        CVar10.decUI = local_b8[0].decUI;
        LHSKind = (NodeKind)local_a8;
        if (local_a8._1_1_ != EmptyKind) {
          LHSKind = TwineKind;
          CVar10.twine = (Twine *)local_b8;
        }
        if (cStack_67 != '\x01') {
          local_68 = TwineKind;
        }
        CVar2._4_4_ = uStack_74;
        CVar2.decUI = local_78;
        CVar9.twine = (Twine *)&local_78;
        if (cStack_67 == '\x01') {
          CVar9 = CVar2;
        }
        llvm::Twine::Twine(&local_98,CVar10,LHSKind,CVar9,local_68);
      }
      Errs = llvm::errs();
    }
    else {
      pcVar8 = "multi-valued option specified with ValueDisallowed modifier!";
LAB_00117ebe:
      llvm::Twine::Twine(&local_98,pcVar8);
      Errs = llvm::errs();
    }
    llvm::cl::Option::error(Handler,&local_98,(StringRef)ZEXT816(0),Errs);
    bVar4 = true;
  }
  else {
    if ((uVar5 == 2) && (local_e0.Data == (char *)0x0)) {
      iVar1 = *i;
      iVar6 = iVar1 + 1;
      if (local_cc <= iVar6) {
        pcVar8 = "requires a value!";
        goto LAB_00117ebe;
      }
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x221,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      *i = iVar6;
      pcVar8 = argv[(long)iVar1 + 1];
      if (pcVar8 == (char *)0x0) {
        local_e0.Length = 0;
        local_e0.Data = pcVar8;
      }
      else {
        local_e0.Length = strlen(pcVar8);
        local_e0.Data = pcVar8;
      }
    }
LAB_00117da5:
    if (uVar7 == 0) {
      Value_00.Length = local_e0.Length;
      Value_00.Data = local_e0.Data;
      ArgName_02.Length = local_c0;
      ArgName_02.Data = local_c8;
      bVar4 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName_02,Value_00,false);
    }
    else {
      MultiArg = local_e0.Data != (char *)0x0;
      if (MultiArg) {
        ArgName_00.Length = local_c0;
        ArgName_00.Data = local_c8;
        Value_01.Length = local_e0.Length;
        Value_01.Data = local_e0.Data;
        bVar4 = CommaSeparateAndAddOccurrence(Handler,*i,ArgName_00,Value_01,false);
        if (bVar4) {
          return true;
        }
        uVar7 = uVar7 - 1;
      }
      if (uVar7 == 0) {
        bVar4 = false;
      }
      else {
        do {
          uVar7 = uVar7 - 1;
          iVar1 = *i;
          uVar5 = iVar1 + 1;
          if (local_cc <= (int)uVar5) {
            pcVar8 = "not enough values!";
            goto LAB_00117ebe;
          }
          if (argv == (char **)0x0) {
            __assert_fail("argv && \"null check\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                          ,0x243,
                          "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                         );
          }
          *i = uVar5;
          pcVar8 = argv[(long)iVar1 + 1];
          if (pcVar8 == (char *)0x0) {
            local_e0.Length = 0;
          }
          else {
            local_e0.Length = strlen(pcVar8);
          }
          ArgName_01.Length = local_c0;
          ArgName_01.Data = local_c8;
          Value_02.Length = local_e0.Length;
          Value_02.Data = pcVar8;
          local_e0.Data = pcVar8;
          bVar4 = CommaSeparateAndAddOccurrence(Handler,uVar5,ArgName_01,Value_02,MultiArg);
        } while ((!bVar4) && (MultiArg = true, uVar7 != 0));
      }
    }
  }
  return bVar4;
}

Assistant:

static inline bool ProvideOption(Option *Handler, StringRef ArgName,
                                 StringRef Value, int argc,
                                 const char *const *argv, int &i) {
  // Is this a multi-argument option?
  unsigned NumAdditionalVals = Handler->getNumAdditionalVals();

  // Enforce value requirements
  switch (Handler->getValueExpectedFlag()) {
  case ValueRequired:
    if (!Value.data()) { // No value specified?
      if (i + 1 >= argc)
        return Handler->error("requires a value!");
      // Steal the next argument, like for '-o filename'
      assert(argv && "null check");
      Value = StringRef(argv[++i]);
    }
    break;
  case ValueDisallowed:
    if (NumAdditionalVals > 0)
      return Handler->error("multi-valued option specified"
                            " with ValueDisallowed modifier!");

    if (Value.data())
      return Handler->error("does not allow a value! '" + Twine(Value) +
                            "' specified.");
    break;
  case ValueOptional:
    break;
  }

  // If this isn't a multi-arg option, just run the handler.
  if (NumAdditionalVals == 0)
    return CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value);

  // If it is, run the handle several times.
  bool MultiArg = false;

  if (Value.data()) {
    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    --NumAdditionalVals;
    MultiArg = true;
  }

  while (NumAdditionalVals > 0) {
    if (i + 1 >= argc)
      return Handler->error("not enough values!");
    assert(argv && "null check");
    Value = StringRef(argv[++i]);

    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    MultiArg = true;
    --NumAdditionalVals;
  }
  return false;
}